

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_amend.c
# Opt level: O1

LY_ERR lys_precompile_nodeid(ly_ctx *ctx,char *str,lysc_nodeid **nodeid)

{
  LY_ERR LVar1;
  uint uVar2;
  size_t expr_len;
  lysc_nodeid *plVar3;
  char **ppcVar4;
  char *pcVar5;
  size_t len;
  char *pcVar6;
  uint uVar7;
  lyxp_expr *exp;
  lyxp_expr *local_48;
  ly_ctx *local_40;
  char *local_38;
  
  local_48 = (lyxp_expr *)0x0;
  *nodeid = (lysc_nodeid *)0x0;
  expr_len = strlen(str);
  LVar1 = lyxp_expr_parse(ctx,str,expr_len,'\0',&local_48);
  if (LVar1 == LY_SUCCESS) {
    plVar3 = (lysc_nodeid *)calloc(1,0x20);
    *nodeid = plVar3;
    if (plVar3 == (lysc_nodeid *)0x0) {
LAB_0015407c:
      LVar1 = LY_EMEM;
      ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_precompile_nodeid");
    }
    else {
      plVar3->str = str;
      uVar7 = 0;
      uVar2 = 0;
      local_40 = ctx;
      local_38 = str;
      if (*local_48->tokens == LYXP_TOKEN_NAMETEST) goto LAB_00153f56;
      while (uVar7 < local_48->used) {
        if (local_48->tokens[uVar7] != LYXP_TOKEN_OPER_PATH) {
          __assert_fail("exp->tokens[i] == LYXP_TOKEN_OPER_PATH",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_amend.c"
                        ,0x67,
                        "LY_ERR lys_precompile_nodeid(const struct ly_ctx *, const char *, struct lysc_nodeid **)"
                       );
        }
        uVar2 = uVar7 + 1;
LAB_00153f56:
        pcVar6 = local_38;
        ppcVar4 = (char **)realloc((*nodeid)->prefix,(ulong)((*nodeid)->count + 1) << 3);
        if (ppcVar4 == (char **)0x0) goto LAB_0015407c;
        (*nodeid)->prefix = ppcVar4;
        (*nodeid)->prefix[(*nodeid)->count] = (char *)0x0;
        ppcVar4 = (char **)realloc((*nodeid)->name,(ulong)((*nodeid)->count + 1) << 3);
        if (ppcVar4 == (char **)0x0) goto LAB_0015407c;
        (*nodeid)->name = ppcVar4;
        (*nodeid)->name[(*nodeid)->count] = (char *)0x0;
        (*nodeid)->count = (*nodeid)->count + 1;
        if (local_48->tokens[uVar2] != LYXP_TOKEN_NAMETEST) {
          __assert_fail("exp->tokens[i] == LYXP_TOKEN_NAMETEST",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_amend.c"
                        ,0x79,
                        "LY_ERR lys_precompile_nodeid(const struct ly_ctx *, const char *, struct lysc_nodeid **)"
                       );
        }
        pcVar6 = pcVar6 + local_48->tok_pos[uVar2];
        len = (size_t)local_48->tok_len[uVar2];
        pcVar5 = ly_strnchr(pcVar6,0x3a,len);
        if (pcVar5 != (char *)0x0) {
          LVar1 = lydict_insert(ctx,pcVar6,(long)pcVar5 - (long)pcVar6,
                                (*nodeid)->prefix + ((*nodeid)->count - 1));
          ctx = local_40;
          if (LVar1 != LY_SUCCESS) goto LAB_001540a1;
          len = len + ~((long)pcVar5 - (long)pcVar6);
          pcVar6 = pcVar5 + 1;
        }
        LVar1 = lydict_insert(ctx,pcVar6,len,(*nodeid)->name + ((*nodeid)->count - 1));
        if (LVar1 != LY_SUCCESS) goto LAB_001540a1;
        uVar7 = uVar2 + 1;
      }
      LVar1 = LY_SUCCESS;
    }
  }
LAB_001540a1:
  lyxp_expr_free(ctx,local_48);
  if (LVar1 != LY_SUCCESS) {
    lysc_nodeid_free(ctx,*nodeid);
    *nodeid = (lysc_nodeid *)0x0;
  }
  return LVar1;
}

Assistant:

static LY_ERR
lys_precompile_nodeid(const struct ly_ctx *ctx, const char *str, struct lysc_nodeid **nodeid)
{
    LY_ERR rc = LY_SUCCESS;
    struct lyxp_expr *exp = NULL;
    void *mem;
    const char *ptr, *name;
    size_t len;
    uint32_t i;

    *nodeid = NULL;

    /* parse */
    rc = lyxp_expr_parse(ctx, str, strlen(str), 0, &exp);
    LY_CHECK_GOTO(rc, cleanup);

    /* alloc */
    *nodeid = calloc(1, sizeof **nodeid);
    LY_CHECK_ERR_GOTO(!*nodeid, LOGMEM(ctx); rc = LY_EMEM, cleanup);

    /* store the full schema-node-id */
    (*nodeid)->str = str;

    /* absolute vs. relative path */
    i = 0;
    if (exp->tokens[0] == LYXP_TOKEN_NAMETEST) {
        goto relative_path;
    }

    while (i < exp->used) {
        /* skip '/' */
        assert(exp->tokens[i] == LYXP_TOKEN_OPER_PATH);
        ++i;

relative_path:
        /* new node */
        mem = realloc((*nodeid)->prefix, ((*nodeid)->count + 1) * sizeof *(*nodeid)->prefix);
        LY_CHECK_ERR_GOTO(!mem, LOGMEM(ctx); rc = LY_EMEM, cleanup);
        (*nodeid)->prefix = mem;
        (*nodeid)->prefix[(*nodeid)->count] = NULL;

        mem = realloc((*nodeid)->name, ((*nodeid)->count + 1) * sizeof *(*nodeid)->name);
        LY_CHECK_ERR_GOTO(!mem, LOGMEM(ctx); rc = LY_EMEM, cleanup);
        (*nodeid)->name = mem;
        (*nodeid)->name[(*nodeid)->count] = NULL;

        ++(*nodeid)->count;

        /* compile the name test */
        assert(exp->tokens[i] == LYXP_TOKEN_NAMETEST);
        name = str + exp->tok_pos[i];
        len = exp->tok_len[i];
        ptr = ly_strnchr(name, ':', len);
        if (ptr) {
            /* store prefix */
            rc = lydict_insert(ctx, name, ptr - name, &(*nodeid)->prefix[(*nodeid)->count - 1]);
            LY_CHECK_GOTO(rc, cleanup);

            /* move name */
            len -= (ptr - name) + 1;
            name = ptr + 1;
        }

        /* store name */
        rc = lydict_insert(ctx, name, len, &(*nodeid)->name[(*nodeid)->count - 1]);
        LY_CHECK_GOTO(rc, cleanup);

        ++i;
    }

cleanup:
    lyxp_expr_free(ctx, exp);
    if (rc) {
        lysc_nodeid_free(ctx, *nodeid);
        *nodeid = NULL;
    }
    return rc;
}